

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

bool __thiscall duckdb::TopNHeap::EntryShouldBeAdded(TopNHeap *this,string_t *sort_key)

{
  pointer left;
  bool bVar1;
  
  left = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
         super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
         super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)left) / 0x18) <
      this->heap_size) {
    return true;
  }
  bVar1 = string_t::StringComparisonOperators::GreaterThan(&left->sort_key,sort_key);
  return bVar1;
}

Assistant:

inline bool EntryShouldBeAdded(const string_t &sort_key) {
		if (heap.size() < heap_size) {
			// heap is full - check the latest entry
			return true;
		}
		if (sort_key < heap.front().sort_key) {
			// sort key is smaller than current max value
			return true;
		}
		// heap is full and there is no room for the entry
		return false;
	}